

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void __thiscall duckdb::FSSTCompressionState::~FSSTCompressionState(FSSTCompressionState *this)

{
  pointer puVar1;
  
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__FSSTCompressionState_02445f00;
  if (this->fsst_encoder != (duckdb_fsst_encoder_t *)0x0) {
    duckdb_fsst_destroy(this->fsst_encoder);
  }
  puVar1 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  BufferHandle::~BufferHandle(&this->current_handle);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            (&(this->current_segment).
              super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>);
  return;
}

Assistant:

~FSSTCompressionState() override {
		if (fsst_encoder) {
			duckdb_fsst_destroy(fsst_encoder);
		}
	}